

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O0

void injection::InjectionManager::bind<ITest>(function<ITest_*()> *maker,InjectionScope scope)

{
  function<ITest_*()> local_48;
  shared_ptr<ITest> local_28;
  InjectionScope local_14;
  function<ITest_*()> *pfStack_10;
  InjectionScope scope_local;
  function<ITest_*()> *maker_local;
  
  local_14 = scope;
  pfStack_10 = maker;
  std::function<ITest_*()>::function(&local_48,maker);
  injection_private::InjectionEngine<ITest>::config
            ((InjectionEngine<ITest> *)&local_28,&local_48,SET,local_14);
  std::shared_ptr<ITest>::~shared_ptr(&local_28);
  std::function<ITest_*()>::~function(&local_48);
  return;
}

Assistant:

static void bind(std::function<I*()> maker, InjectionScope scope) {
        static injection_private::InjectionEngine<I> phony;
        phony.config(maker, injection_private::InjectionCommand::SET, scope);
    }